

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O0

void caffe::UpgradeNetBatchNorm(NetParameter *net_param)

{
  bool bVar1;
  int iVar2;
  LayerParameter *pLVar3;
  string *__lhs;
  ParamSpec *this;
  ParamSpec *fixed_param_spec;
  int ip;
  int i;
  NetParameter *net_param_local;
  
  for (fixed_param_spec._4_4_ = 0; iVar2 = NetParameter::layer_size(net_param),
      fixed_param_spec._4_4_ < iVar2; fixed_param_spec._4_4_ = fixed_param_spec._4_4_ + 1) {
    pLVar3 = NetParameter::layer(net_param,fixed_param_spec._4_4_);
    __lhs = LayerParameter::type_abi_cxx11_(pLVar3);
    bVar1 = std::operator==(__lhs,"BatchNorm");
    if (bVar1) {
      pLVar3 = NetParameter::layer(net_param,fixed_param_spec._4_4_);
      iVar2 = LayerParameter::param_size(pLVar3);
      if (iVar2 == 3) {
        fixed_param_spec._0_4_ = 0;
        while( true ) {
          pLVar3 = NetParameter::layer(net_param,fixed_param_spec._4_4_);
          iVar2 = LayerParameter::param_size(pLVar3);
          if (iVar2 <= (int)fixed_param_spec) break;
          pLVar3 = NetParameter::mutable_layer(net_param,fixed_param_spec._4_4_);
          this = LayerParameter::mutable_param(pLVar3,(int)fixed_param_spec);
          ParamSpec::set_lr_mult(this,0.0);
          ParamSpec::set_decay_mult(this,0.0);
          fixed_param_spec._0_4_ = (int)fixed_param_spec + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void UpgradeNetBatchNorm(NetParameter* net_param) {
  for (int i = 0; i < net_param->layer_size(); ++i) {
    // Check if BatchNorm layers declare three parameters, as required by
    // the previous BatchNorm layer definition.
    if (net_param->layer(i).type() == "BatchNorm"
        && net_param->layer(i).param_size() == 3) {
      // set lr_mult and decay_mult to zero. leave all other param intact.
      for (int ip = 0; ip < net_param->layer(i).param_size(); ip++) {
        ParamSpec* fixed_param_spec =
          net_param->mutable_layer(i)->mutable_param(ip);
        fixed_param_spec->set_lr_mult(0.f);
        fixed_param_spec->set_decay_mult(0.f);
      }
    }
  }
}